

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O3

value_and_holder * __thiscall
pybind11::detail::instance::get_value_and_holder
          (value_and_holder *__return_storage_ptr__,instance *this,type_info *find_type,
          bool throw_if_missing)

{
  PyTypeObject *t;
  anon_union_24_2_63b86169_for_instance_1 *paVar1;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar2;
  values_and_holders vhs;
  iterator it;
  values_and_holders local_68 [2];
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  type_info *local_38;
  void **ppvStack_30;
  
  if (find_type == (type_info *)0x0) {
    __return_storage_ptr__->inst = this;
    __return_storage_ptr__->index = 0;
    __return_storage_ptr__->type = (type_info *)0x0;
  }
  else {
    t = (this->ob_base).ob_type;
    if (t != find_type->type) {
      local_68[0].inst = this;
      pVar2 = all_type_info_get_cache
                        ((PyTypeObject *)
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        all_type_info_populate
                  (t,(vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                      *)((long)pVar2.first.
                               super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                               ._M_cur.
                               super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                        + 0x10));
      }
      local_68[0].tinfo =
           (type_vec *)
           ((long)pVar2.first.
                  super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                  ._M_cur.
                  super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
           + 0x10);
      values_and_holders::find((iterator *)(local_68 + 1),local_68,find_type);
      if (CONCAT44(uStack_3c,uStack_40) ==
          (long)((local_68[0].tinfo)->
                super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)((local_68[0].tinfo)->
                super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                )._M_impl.super__Vector_impl_data._M_start >> 3) {
        if (throw_if_missing) {
          pybind11_fail(
                       "pybind11::detail::instance::get_value_and_holder: type is not a pybind11 base of the given instance (#define PYBIND11_DETAILED_ERROR_MESSAGES or compile in debug mode for type details)"
                       );
        }
        in_stack_ffffffffffffffb8 = 0;
        in_stack_ffffffffffffffbc = 0;
        uStack_40 = 0;
        uStack_3c = 0;
        __return_storage_ptr__->type = (type_info *)0x0;
        __return_storage_ptr__->vh = (void **)0x0;
      }
      else {
        __return_storage_ptr__->type = local_38;
        __return_storage_ptr__->vh = ppvStack_30;
      }
      *(undefined4 *)&__return_storage_ptr__->inst = in_stack_ffffffffffffffb8;
      *(undefined4 *)((long)&__return_storage_ptr__->inst + 4) = in_stack_ffffffffffffffbc;
      *(undefined4 *)&__return_storage_ptr__->index = uStack_40;
      *(undefined4 *)((long)&__return_storage_ptr__->index + 4) = uStack_3c;
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->inst = this;
    __return_storage_ptr__->index = 0;
    __return_storage_ptr__->type = find_type;
  }
  if ((this->field_0x30 & 2) == 0) {
    paVar1 = (anon_union_24_2_63b86169_for_instance_1 *)(this->field_1).simple_value_holder[0];
  }
  else {
    paVar1 = &this->field_1;
  }
  __return_storage_ptr__->vh = (void **)paVar1;
  return __return_storage_ptr__;
}

Assistant:

PYBIND11_NOINLINE value_and_holder
instance::get_value_and_holder(const type_info *find_type /*= nullptr default in common.h*/,
                               bool throw_if_missing /*= true in common.h*/) {
    // Optimize common case:
    if (!find_type || Py_TYPE(this) == find_type->type) {
        return value_and_holder(this, find_type, 0, 0);
    }

    detail::values_and_holders vhs(this);
    auto it = vhs.find(find_type);
    if (it != vhs.end()) {
        return *it;
    }

    if (!throw_if_missing) {
        return value_and_holder();
    }

#if defined(PYBIND11_DETAILED_ERROR_MESSAGES)
    pybind11_fail("pybind11::detail::instance::get_value_and_holder: `"
                  + get_fully_qualified_tp_name(find_type->type)
                  + "' is not a pybind11 base of the given `"
                  + get_fully_qualified_tp_name(Py_TYPE(this)) + "' instance");
#else
    pybind11_fail(
        "pybind11::detail::instance::get_value_and_holder: "
        "type is not a pybind11 base of the given instance "
        "(#define PYBIND11_DETAILED_ERROR_MESSAGES or compile in debug mode for type details)");
#endif
}